

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O3

string * encode_compute_hmac_sha1
                   (string *__return_storage_ptr__,string *access_key,char *buf_in,int len_buf_in)

{
  mbedtls_md_info_t *md_info;
  size_t sVar1;
  size_t output_len;
  char output [20];
  mbedtls_md_context_t ctx;
  char encoded [512];
  size_t local_280;
  uchar local_278 [32];
  mbedtls_md_context_t local_258;
  uchar local_238 [520];
  
  local_258.hmac_ctx = (void *)0x0;
  local_258.md_info = (mbedtls_md_info_t *)0x0;
  local_258.md_ctx = (void *)0x0;
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx(&local_258,md_info);
  local_278[0] = '\0';
  local_278[1] = '\0';
  local_278[2] = '\0';
  local_278[3] = '\0';
  local_278[4] = '\0';
  local_278[5] = '\0';
  local_278[6] = '\0';
  local_278[7] = '\0';
  local_278[8] = '\0';
  local_278[9] = '\0';
  local_278[10] = '\0';
  local_278[0xb] = '\0';
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  memset(local_238,0,0x200);
  mbedtls_md_hmac_starts
            (&local_258,(uchar *)(access_key->_M_dataplus)._M_p,access_key->_M_string_length);
  mbedtls_md_hmac_update(&local_258,(uchar *)buf_in,(long)len_buf_in);
  mbedtls_md_hmac_finish(&local_258,local_278);
  local_280 = 0;
  mbedtls_base64_encode(local_238,0x200,&local_280,local_278,0x14);
  mbedtls_md_free(&local_258);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen((char *)local_238);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_238,local_238 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_hmac_sha1(std::string access_key, char* buf_in, int len_buf_in) {
  int res = 0;

  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t * sha1_md = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx(&ctx, sha1_md);
  char output[20] = {};
  char encoded[512] = {};
  
  res = mbedtls_md_hmac_starts(&ctx, (const unsigned char*)access_key.c_str(), access_key.size());
  res = mbedtls_md_hmac_update(&ctx, (const unsigned char*)buf_in, len_buf_in);
  res = mbedtls_md_hmac_finish(&ctx, (unsigned char*)output);

  size_t output_len = 0;
  mbedtls_base64_encode((unsigned char*)encoded, sizeof(encoded), &output_len, (const unsigned char*)output, 20);
  mbedtls_md_free(&ctx);
  return encoded;
}